

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O0

ScriptFunctionType * __thiscall Js::ScriptFunction::DuplicateType(ScriptFunction *this)

{
  ScriptContext *this_00;
  Recycler *pRVar1;
  ScriptFunctionType *this_01;
  ScriptFunctionType *type_00;
  FunctionProxy *this_02;
  TrackAllocData local_40;
  ScriptFunctionType *local_18;
  ScriptFunctionType *type;
  ScriptFunction *this_local;
  
  type = (ScriptFunctionType *)this;
  this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  pRVar1 = ScriptContext::GetRecycler(this_00);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,(type_info *)&ScriptFunctionType::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
             ,0xd4);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_40);
  this_01 = (ScriptFunctionType *)new<Memory::Recycler>(0x40,pRVar1,0x43c4b0);
  type_00 = GetScriptFunctionType(this);
  ScriptFunctionType::ScriptFunctionType(this_01,type_00);
  local_18 = this_01;
  this_02 = GetFunctionProxy(this);
  FunctionProxy::RegisterFunctionObjectType(this_02,local_18);
  return local_18;
}

Assistant:

ScriptFunctionType * ScriptFunction::DuplicateType()
    {
        ScriptFunctionType* type = RecyclerNew(this->GetScriptContext()->GetRecycler(),
            ScriptFunctionType, this->GetScriptFunctionType());

        this->GetFunctionProxy()->RegisterFunctionObjectType(type);

        return type;
    }